

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O2

void __thiscall
IContactList::ConfigSave(IContactList *this,IConfigManager *pConfigManager,char *pCmdStr)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  int i;
  long lVar6;
  long in_FS_OFFSET;
  char aBuf [128];
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar6 = 0; lVar6 < this->m_NumContacts; lVar6 = lVar6 + 1) {
    str_copy(local_b8,pCmdStr,0x80);
    iVar2 = str_length(local_b8);
    lVar3 = (long)iVar2;
    local_b8[lVar3] = '\"';
    pcVar5 = this->m_aContacts[lVar6].m_aName;
    for (pcVar4 = pcVar5; (lVar3 < 0x7b && (cVar1 = *pcVar4, cVar1 != '\0')); pcVar4 = pcVar4 + 1) {
      if ((cVar1 == '\\') || (cVar1 == '\"')) {
        local_b8[lVar3 + 1] = '\\';
        lVar3 = lVar3 + 2;
      }
      else {
        lVar3 = lVar3 + 1;
      }
      local_b8[lVar3] = cVar1;
    }
    (local_b8 + lVar3 + 1)[0] = '\"';
    (local_b8 + lVar3 + 1)[1] = ' ';
    pcVar5 = pcVar5 + 0x41;
    local_b8[lVar3 + 3] = '\"';
    lVar3 = lVar3 + 4;
    while( true ) {
      cVar1 = *pcVar5;
      if ((cVar1 == '\0') || (0x7b < lVar3)) break;
      if ((cVar1 == '\\') || (cVar1 == '\"')) {
        local_b8[lVar3] = '\\';
        lVar3 = lVar3 + 1;
      }
      pcVar5 = pcVar5 + 1;
      local_b8[lVar3] = cVar1;
      lVar3 = lVar3 + 1;
    }
    (local_b8 + lVar3)[0] = '\"';
    (local_b8 + lVar3)[1] = '\0';
    (*(pConfigManager->super_IInterface)._vptr_IInterface[8])(pConfigManager,local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IContactList::ConfigSave(IConfigManager *pConfigManager, const char* pCmdStr)
{
	char aBuf[128];
	const char *pEnd = aBuf+sizeof(aBuf)-4;
	for(int i = 0; i < this->m_NumContacts; ++i)
	{
		str_copy(aBuf, pCmdStr, sizeof(aBuf));

		const char *pSrc = this->m_aContacts[i].m_aName;
		char *pDst = aBuf+str_length(aBuf);
		*pDst++ = '"';
		while(*pSrc && pDst < pEnd)
		{
			if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
				*pDst++ = '\\';
			*pDst++ = *pSrc++;
		}
		*pDst++ = '"';
		*pDst++ = ' ';

		pSrc = this->m_aContacts[i].m_aClan;
		*pDst++ = '"';
		while(*pSrc && pDst < pEnd)
		{
			if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
				*pDst++ = '\\';
			*pDst++ = *pSrc++;
		}
		*pDst++ = '"';
		*pDst++ = 0;

		pConfigManager->WriteLine(aBuf);
	}
}